

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O1

void __thiscall
TasGrid::TasmanianSparseGrid::getInterpolationWeights
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *weights)

{
  BaseCanonicalGrid *pBVar1;
  MultiIndexSet *pMVar2;
  runtime_error *this_00;
  size_type __new_size;
  
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  if ((long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_finish -
      (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start >> 3 == (long)pBVar1->num_dimensions) {
    if (pBVar1 == (BaseCanonicalGrid *)0x0) {
      __new_size = 0;
    }
    else {
      pMVar2 = &pBVar1->points;
      if (*(pointer *)
           &(pBVar1->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl ==
          *(pointer *)((long)&(pBVar1->points).indexes + 8)) {
        pMVar2 = &pBVar1->needed;
      }
      __new_size = (size_type)*(int *)((long)pMVar2 + 8);
    }
    ::std::vector<double,_std::allocator<double>_>::resize(weights,__new_size);
    getInterpolationWeights
              (this,(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,
               (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,
             "ERROR: getInterpolationWeights() incorrect size of x, must be same as getNumDimensions()"
            );
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TasmanianSparseGrid::getInterpolationWeights(const std::vector<double> &x, std::vector<double> &weights) const{
    if (x.size() != (size_t) base->getNumDimensions()) throw std::runtime_error("ERROR: getInterpolationWeights() incorrect size of x, must be same as getNumDimensions()");
    weights.resize((size_t) getNumPoints());
    getInterpolationWeights(x.data(), weights.data());
}